

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintExpressionContents::visitBrOn(PrintExpressionContents *this,BrOn *curr)

{
  undefined8 in_RAX;
  long lVar1;
  Type TVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  switch(curr->op) {
  case BrOnNull:
    poVar4 = this->o;
    Colors::outputColorCode(poVar4,"\x1b[35m");
    Colors::outputColorCode(poVar4,"\x1b[1m");
    pcVar3 = "br_on_null ";
    lVar1 = 0xb;
    break;
  case BrOnNonNull:
    poVar4 = this->o;
    Colors::outputColorCode(poVar4,"\x1b[35m");
    Colors::outputColorCode(poVar4,"\x1b[1m");
    pcVar3 = "br_on_non_null ";
    lVar1 = 0xf;
    break;
  case BrOnCast:
    poVar4 = this->o;
    Colors::outputColorCode(poVar4,"\x1b[35m");
    Colors::outputColorCode(poVar4,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"br_on_cast ",0xb);
    Colors::outputColorCode(poVar4,"\x1b[0m");
    Name::print(&curr->name,this->o);
    uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
    TVar2.id = (curr->ref->type).id;
    if (TVar2.id == 1) {
      TVar2.id = (curr->castType).id;
    }
    PrintSExpression::printType(this->parent,TVar2);
    poVar4 = this->o;
    pcVar3 = (char *)((long)&uStack_28 + 6);
    goto LAB_00a434d3;
  case BrOnCastFail:
    poVar4 = this->o;
    Colors::outputColorCode(poVar4,"\x1b[35m");
    Colors::outputColorCode(poVar4,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"br_on_cast_fail ",0x10);
    Colors::outputColorCode(poVar4,"\x1b[0m");
    Name::print(&curr->name,this->o);
    uStack_28._0_6_ = CONCAT15(0x20,(undefined5)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 5),1);
    TVar2.id = (curr->ref->type).id;
    if (TVar2.id == 1) {
      TVar2.id = (curr->castType).id;
    }
    PrintSExpression::printType(this->parent,TVar2);
    poVar4 = this->o;
    pcVar3 = (char *)((long)&uStack_28 + 4);
LAB_00a434d3:
    *pcVar3 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,1);
    PrintSExpression::printType(this->parent,(Type)(curr->castType).id);
    return;
  default:
    handle_unreachable("Unexpected br_on* op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x901);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar1);
  Colors::outputColorCode(poVar4,"\x1b[0m");
  Name::print(&curr->name,this->o);
  return;
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
        printMedium(o, "br_on_null ");
        curr->name.print(o);
        return;
      case BrOnNonNull:
        printMedium(o, "br_on_non_null ");
        curr->name.print(o);
        return;
      case BrOnCast:
        printMedium(o, "br_on_cast ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          // Need to print some reference type in the correct hierarchy rather
          // than unreachable, and the cast type itself is the best possible
          // option.
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
      case BrOnCastFail:
        printMedium(o, "br_on_cast_fail ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
    }
    WASM_UNREACHABLE("Unexpected br_on* op");
  }